

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_dead_code_elimination.cpp
# Opt level: O0

void __thiscall
optimization::complex_dce::ComplexDceRunner::calc_remained_vars(ComplexDceRunner *this)

{
  bool bVar1;
  long in_RDI;
  pair<std::__detail::_Node_iterator<mir::inst::VarId,_true,_true>,_bool> pVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>_>
  pVar3;
  type *end_2;
  type *it_2;
  value_type v_1;
  VarId x_1;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *__range3_1;
  type *end_1;
  type *it_1;
  type *end;
  type *it;
  value_type v;
  VarId x;
  iterator __end3;
  iterator __begin3;
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *__range3;
  bool changed;
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  visited;
  deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> remaining;
  VarId *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  _Node_iterator_base<mir::inst::VarId,_true> in_stack_fffffffffffffcd8;
  _Node_iterator_base<mir::inst::VarId,_true> in_stack_fffffffffffffce0;
  _Node_iterator_base<mir::inst::VarId,_true> in_stack_fffffffffffffcf0;
  _Node_iterator_base<mir::inst::VarId,_true> in_stack_fffffffffffffd20;
  _Node_iterator_base<mir::inst::VarId,_true> local_230;
  _Node_iterator_base<mir::inst::VarId,_true> local_228;
  _Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true> local_220;
  _Node_iterator_base<mir::inst::VarId,_true> local_218;
  _Node_iterator_base<mir::inst::VarId,_true> local_210;
  _Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true> *local_208;
  _Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true> *local_200;
  pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>_>
  local_1f8;
  _Node_iterator_base<mir::inst::VarId,_true> local_1e8;
  byte local_1e0;
  _Node_iterator_base<mir::inst::VarId,_true> local_1d8;
  byte local_1d0;
  _Node_iterator_base<mir::inst::VarId,_true> local_1a8;
  _Node_iterator_base<mir::inst::VarId,_true> local_1a0;
  long local_198;
  _Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true> local_190;
  _Node_iterator_base<mir::inst::VarId,_true> local_188;
  undefined1 local_180;
  _Node_iterator_base<mir::inst::VarId,_true> local_178;
  undefined1 local_170;
  _Node_iterator_base<mir::inst::VarId,_true> local_168;
  byte local_160;
  _Node_iterator_base<mir::inst::VarId,_true> local_158;
  byte local_150;
  _Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true> *local_148;
  _Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true> *local_140;
  pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>_>
  local_138;
  _Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true> local_128;
  _Node_iterator_base<mir::inst::VarId,_true> local_120;
  _Node_iterator_base<mir::inst::VarId,_true> local_118;
  _Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true> *local_110;
  _Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true> *local_108;
  pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>_>
  local_100;
  _Node_iterator_base<mir::inst::VarId,_true> local_f0;
  undefined1 local_e8;
  _Node_iterator_base<mir::inst::VarId,_true> local_b0;
  _Node_iterator_base<mir::inst::VarId,_true> local_a8;
  long local_a0;
  byte local_91;
  
  std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::deque
            ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x1f712c);
  std::
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::unordered_set((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   *)0x1f7139);
  local_91 = 1;
  while ((local_91 & 1) != 0) {
    local_91 = 0;
    std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::clear
              ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               in_stack_fffffffffffffcf0._M_cur);
    local_a0 = in_RDI + 0x48;
    local_a8._M_cur =
         (__node_type *)
         std::
         unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
         ::begin((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_fffffffffffffcc8);
    local_b0._M_cur =
         (__node_type *)
         std::
         unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
         ::end((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_fffffffffffffcc8);
    while( true ) {
      bVar1 = std::__detail::operator!=(&local_a8,&local_b0);
      if (!bVar1) break;
      std::__detail::_Node_iterator<mir::inst::VarId,_true,_true>::operator*
                ((_Node_iterator<mir::inst::VarId,_true,_true> *)0x1f71cd);
      mir::inst::VarId::VarId
                ((VarId *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffcc8);
      std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffcc8);
      std::__detail::_Node_iterator<mir::inst::VarId,_true,_true>::operator++
                ((_Node_iterator<mir::inst::VarId,_true,_true> *)
                 CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    }
    while( true ) {
      bVar1 = std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::empty
                        ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x1f724f);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::front
                ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 in_stack_fffffffffffffce0._M_cur);
      mir::inst::VarId::VarId
                ((VarId *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffcc8);
      std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::pop_front
                ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
      pVar2 = std::
              unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::insert((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        *)in_stack_fffffffffffffce0._M_cur,
                       (value_type *)in_stack_fffffffffffffcd8._M_cur);
      local_f0._M_cur =
           (__node_type *)pVar2.first.super__Node_iterator_base<mir::inst::VarId,_true>._M_cur;
      local_e8 = pVar2.second;
      pVar3 = std::
              unordered_multimap<mir::inst::VarId,_mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
              ::equal_range((unordered_multimap<mir::inst::VarId,_mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                             *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                            in_stack_fffffffffffffcc8);
      local_100 = pVar3;
      local_108 = &std::
                   get<0ul,std::__detail::_Node_iterator<std::pair<mir::inst::VarId_const,mir::inst::VarId>,false,true>,std::__detail::_Node_iterator<std::pair<mir::inst::VarId_const,mir::inst::VarId>,false,true>>
                             ((pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>_>
                               *)0x1f7333)->
                   super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
      ;
      local_110 = &std::
                   get<1ul,std::__detail::_Node_iterator<std::pair<mir::inst::VarId_const,mir::inst::VarId>,false,true>,std::__detail::_Node_iterator<std::pair<mir::inst::VarId_const,mir::inst::VarId>,false,true>>
                             ((pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>_>
                               *)0x1f7348)->
                   super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
      ;
      while( true ) {
        bVar1 = std::__detail::operator!=(local_108,local_110);
        if (!bVar1) break;
        std::__detail::
        _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>::operator->
                  ((_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>
                    *)0x1f737b);
        local_118._M_cur =
             (__node_type *)
             std::
             unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
             ::find((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                     *)in_stack_fffffffffffffcc8,(key_type *)0x1f738f);
        local_120._M_cur =
             (__node_type *)
             std::
             unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
             ::end((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)in_stack_fffffffffffffcc8);
        bVar1 = std::__detail::operator==(&local_118,&local_120);
        if (bVar1) {
          std::__detail::
          _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>::
          operator->((_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>
                      *)0x1f73e6);
          std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                    ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                     in_stack_fffffffffffffcc8);
        }
        local_128._M_cur =
             (__node_type *)
             std::__detail::
             _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>::
             operator++((_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>
                         *)in_stack_fffffffffffffcc8,0);
      }
      pVar3 = std::
              unordered_multimap<mir::inst::VarId,_mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
              ::equal_range((unordered_multimap<mir::inst::VarId,_mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                             *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                            in_stack_fffffffffffffcc8);
      local_138 = pVar3;
      local_140 = &std::
                   get<0ul,std::__detail::_Node_iterator<std::pair<mir::inst::VarId_const,mir::inst::VarId>,false,true>,std::__detail::_Node_iterator<std::pair<mir::inst::VarId_const,mir::inst::VarId>,false,true>>
                             ((pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>_>
                               *)0x1f7477)->
                   super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
      ;
      local_148 = &std::
                   get<1ul,std::__detail::_Node_iterator<std::pair<mir::inst::VarId_const,mir::inst::VarId>,false,true>,std::__detail::_Node_iterator<std::pair<mir::inst::VarId_const,mir::inst::VarId>,false,true>>
                             ((pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>_>
                               *)0x1f748c)->
                   super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
      ;
      while( true ) {
        bVar1 = std::__detail::operator!=(local_140,local_148);
        if (!bVar1) break;
        std::__detail::
        _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>::operator->
                  ((_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>
                    *)0x1f74d0);
        pVar2 = std::
                unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::insert((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)in_stack_fffffffffffffce0._M_cur,
                         (value_type *)in_stack_fffffffffffffcd8._M_cur);
        local_168._M_cur =
             (__node_type *)pVar2.first.super__Node_iterator_base<mir::inst::VarId,_true>._M_cur;
        local_160 = pVar2.second;
        local_91 = (local_91 | local_160) & 1;
        local_158._M_cur = local_168._M_cur;
        local_150 = local_160;
        pVar2 = std::
                unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::insert((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)in_stack_fffffffffffffce0._M_cur,
                         (value_type *)in_stack_fffffffffffffcd8._M_cur);
        local_188._M_cur =
             (__node_type *)pVar2.first.super__Node_iterator_base<mir::inst::VarId,_true>._M_cur;
        local_180 = pVar2.second;
        local_91 = (local_91 & 1) != 0 ||
                   ((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
        local_178._M_cur = local_188._M_cur;
        local_170 = local_180;
        local_190._M_cur =
             (__node_type *)
             std::__detail::
             _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>::
             operator++((_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>
                         *)in_stack_fffffffffffffcc8,0);
      }
    }
    std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::clear
              ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               in_stack_fffffffffffffcf0._M_cur);
    local_198 = in_RDI + 0x10;
    local_1a0._M_cur =
         (__node_type *)
         std::
         unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
         ::begin((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_fffffffffffffcc8);
    local_1a8._M_cur =
         (__node_type *)
         std::
         unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
         ::end((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_fffffffffffffcc8);
    while( true ) {
      bVar1 = std::__detail::operator!=(&local_1a0,&local_1a8);
      if (!bVar1) break;
      std::__detail::_Node_iterator<mir::inst::VarId,_true,_true>::operator*
                ((_Node_iterator<mir::inst::VarId,_true,_true> *)0x1f765e);
      mir::inst::VarId::VarId
                ((VarId *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffcc8);
      std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffcc8);
      std::__detail::_Node_iterator<mir::inst::VarId,_true,_true>::operator++
                ((_Node_iterator<mir::inst::VarId,_true,_true> *)
                 CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    }
    while( true ) {
      bVar1 = std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::empty
                        ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x1f76a7);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::front
                ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 in_stack_fffffffffffffce0._M_cur);
      mir::inst::VarId::VarId
                ((VarId *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffcc8);
      std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::pop_front
                ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
      pVar2 = std::
              unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::insert((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        *)in_stack_fffffffffffffce0._M_cur,
                       (value_type *)in_stack_fffffffffffffcd8._M_cur);
      in_stack_fffffffffffffd20._M_cur =
           (__node_type *)pVar2.first.super__Node_iterator_base<mir::inst::VarId,_true>._M_cur;
      local_1e0 = pVar2.second;
      local_91 = (local_91 | local_1e0) & 1;
      local_1e8._M_cur = in_stack_fffffffffffffd20._M_cur;
      local_1d8._M_cur = in_stack_fffffffffffffd20._M_cur;
      local_1d0 = local_1e0;
      pVar3 = std::
              unordered_multimap<mir::inst::VarId,_mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
              ::equal_range((unordered_multimap<mir::inst::VarId,_mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                             *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                            in_stack_fffffffffffffcc8);
      local_1f8 = pVar3;
      local_200 = &std::
                   get<0ul,std::__detail::_Node_iterator<std::pair<mir::inst::VarId_const,mir::inst::VarId>,false,true>,std::__detail::_Node_iterator<std::pair<mir::inst::VarId_const,mir::inst::VarId>,false,true>>
                             ((pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>_>
                               *)0x1f77a2)->
                   super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
      ;
      local_208 = &std::
                   get<1ul,std::__detail::_Node_iterator<std::pair<mir::inst::VarId_const,mir::inst::VarId>,false,true>,std::__detail::_Node_iterator<std::pair<mir::inst::VarId_const,mir::inst::VarId>,false,true>>
                             ((pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>_>
                               *)0x1f77b7)->
                   super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
      ;
      while( true ) {
        bVar1 = std::__detail::operator!=(local_200,local_208);
        if (!bVar1) break;
        std::__detail::
        _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>::operator->
                  ((_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>
                    *)0x1f77fb);
        in_stack_fffffffffffffcf0._M_cur =
             (__node_type *)
             std::
             unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
             ::find((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                     *)in_stack_fffffffffffffcc8,(key_type *)0x1f780c);
        local_210._M_cur = in_stack_fffffffffffffcf0._M_cur;
        local_218._M_cur =
             (__node_type *)
             std::
             unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
             ::end((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)in_stack_fffffffffffffcc8);
        bVar1 = std::__detail::operator==(&local_210,&local_218);
        if (bVar1) {
          std::__detail::
          _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>::
          operator->((_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>
                      *)0x1f7861);
          std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                    ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                     in_stack_fffffffffffffcc8);
        }
        local_220._M_cur =
             (__node_type *)
             std::__detail::
             _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>::
             operator++((_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>
                         *)in_stack_fffffffffffffcc8,0);
      }
      in_stack_fffffffffffffce0._M_cur =
           (__node_type *)
           std::
           unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
           ::find((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   *)in_stack_fffffffffffffcc8,(key_type *)0x1f78b0);
      local_228._M_cur = in_stack_fffffffffffffce0._M_cur;
      local_230._M_cur =
           (__node_type *)
           std::
           unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
           ::end((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_fffffffffffffcc8);
      bVar1 = std::__detail::operator!=(&local_228,&local_230);
      if (bVar1) {
        pVar2 = std::
                unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::insert((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)in_stack_fffffffffffffce0._M_cur,
                         (value_type *)in_stack_fffffffffffffcd8._M_cur);
        in_stack_fffffffffffffcd8._M_cur =
             (__node_type *)pVar2.first.super__Node_iterator_base<mir::inst::VarId,_true>._M_cur;
        in_stack_fffffffffffffcd7 = pVar2.second;
        local_91 = (local_91 & 1) != 0 ||
                   ((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
      }
    }
  }
  std::
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::~unordered_set((unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)0x1f7998);
  std::deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~deque
            ((deque<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             in_stack_fffffffffffffd20._M_cur);
  return;
}

Assistant:

void ComplexDceRunner::calc_remained_vars() {
  // Add all stored variables to root vars
  std::deque<VarId> remaining;
  std::unordered_set<VarId> visited;

  bool changed = true;

  while (changed) {
    changed = false;

    remaining.clear();
    for (auto x : ref_vars) remaining.push_back(x);
    while (!remaining.empty()) {
      auto v = remaining.front();
      remaining.pop_front();
      visited.insert(v);
      for (auto [it, end] = invert_dependance.equal_range(v); it != end; it++) {
        if (visited.find(it->second) == visited.end()) {
          remaining.push_back(it->second);
        }
      }
      for (auto [it, end] = store_dependance.equal_range(v); it != end; it++) {
        changed |= do_not_delete.insert(it->second).second;
        changed |= do_not_delete.insert(v).second;
      }
    }

    // Add all dependant of root vars
    remaining.clear();
    for (auto x : do_not_delete) remaining.push_back(x);
    while (!remaining.empty()) {
      auto v = remaining.front();
      remaining.pop_front();
      changed |= do_not_delete.insert(v).second;
      for (auto [it, end] = var_dependance.equal_range(v); it != end; it++) {
        if (do_not_delete.find(it->second) == do_not_delete.end()) {
          remaining.push_back(it->second);
        }
      }
      if (backup_ref_vars.find(v) != backup_ref_vars.end()) {
        changed |= ref_vars.insert(v).second;
      }
    }
  }
}